

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O0

void nullcRemoveModule(char *module)

{
  int iVar1;
  undefined1 local_30 [8];
  TraceScope traceScope;
  char *module_local;
  
  if ((NULLC::initialized & 1) == 0) {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
  }
  else {
    if (nullcRemoveModule::token == '\0') {
      iVar1 = __cxa_guard_acquire(&nullcRemoveModule::token);
      if (iVar1 != 0) {
        nullcRemoveModule::token = NULLC::TraceGetToken("nullc","nullcRemoveModule");
        __cxa_guard_release(&nullcRemoveModule::token);
      }
    }
    NULLC::TraceScope::TraceScope((TraceScope *)local_30,nullcRemoveModule::token);
    NULLC::TraceLabel(module);
    BinaryCache::RemoveBytecode(module);
    NULLC::TraceScope::~TraceScope((TraceScope *)local_30);
  }
  return;
}

Assistant:

void nullcRemoveModule(const char* module)
{
	using namespace NULLC;
	NULLC_CHECK_INITIALIZED((void)false);

	TRACE_SCOPE("nullc", "nullcRemoveModule");
	TRACE_LABEL(module);

	BinaryCache::RemoveBytecode(module);
}